

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O1

void __thiscall SBmpFile::loadPixelData(SBmpFile *this,byte *buffer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  
  uVar5 = (ulong)(uint)this->height;
  if (0 < this->height) {
    uVar1 = *(uint *)(this->tempHeader + 10);
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (Options::IsBigEndian == '\0') {
      uVar2 = uVar1;
    }
    __n = (size_t)this->width;
    iVar6 = -1;
    lVar7 = 0;
    do {
      iVar3 = (int)uVar5 + iVar6;
      if (this->upsideDown == false) {
        iVar3 = (int)lVar7;
      }
      fseek((FILE *)this->bmp,(long)iVar3 * __n + (ulong)uVar2,0);
      sVar4 = fread(buffer,1,__n,(FILE *)this->bmp);
      if (sVar4 != __n) {
        Error("[SAVENEX] reading BMP pixel data failed",(char *)0x0,FATAL);
      }
      lVar7 = lVar7 + 1;
      uVar5 = (ulong)this->height;
      iVar6 = iVar6 + -1;
      buffer = buffer + __n;
    } while (lVar7 < (long)uVar5);
  }
  return;
}

Assistant:

void SBmpFile::loadPixelData(byte* buffer) {
	uint32_t offset = reinterpret_cast<SAlignSafeCast<uint32_t>*>(tempHeader + 10)->val;
	if (Options::IsBigEndian) offset = sj_bswap32(offset);
	const size_t w = static_cast<size_t>(width);
	for (int32_t y = 0; y < height; ++y) {
		const int32_t fileY = upsideDown ? (height - y - 1) : y;
		fseek(bmp, offset + (w * fileY), SEEK_SET);
		if (w != fread(buffer + (w * y), 1, w, bmp)) {
			Error("[SAVENEX] reading BMP pixel data failed", NULL, FATAL);
		}
	}
}